

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpConnection.cpp
# Opt level: O0

void __thiscall Liby::UdpConnection::destroy(UdpConnection *this)

{
  UdpSocket *this_00;
  Endpoint local_18;
  UdpConnection *local_10;
  UdpConnection *this_local;
  
  local_10 = this;
  if (this->socket_ != (UdpSocket *)0x0) {
    this_00 = this->socket_;
    Endpoint::Endpoint(&local_18,&this->peer_);
    UdpSocket::destroyConn(this_00,&local_18);
    return;
  }
  __assert_fail("socket_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpConnection.cpp"
                ,0x3a,"void Liby::UdpConnection::destroy()");
}

Assistant:

void UdpConnection::destroy() {
    assert(socket_);
    socket_->destroyConn(Endpoint(&peer_));
}